

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

void get_posix_time(time_t *out,curl_off_t timestamp)

{
  curl_off_t timestamp_local;
  time_t *out_local;
  
  if (timestamp < 0x19db1ded53e8000) {
    *out = 0;
  }
  else {
    *out = (timestamp + -0x19db1ded53e8000) / 10000000;
  }
  return;
}

Assistant:

static void get_posix_time(time_t *out, curl_off_t timestamp)
{
  if(timestamp >= CURL_OFF_T_C(116444736000000000)) {
    timestamp -= CURL_OFF_T_C(116444736000000000);
    timestamp /= 10000000;
#if SIZEOF_TIME_T < SIZEOF_CURL_OFF_T
    if(timestamp > TIME_T_MAX)
      *out = TIME_T_MAX;
    else if(timestamp < TIME_T_MIN)
      *out = TIME_T_MIN;
    else
#endif
      *out = (time_t) timestamp;
  }
  else
    *out = 0;
}